

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:557:56)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:557:56)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  uint32_t uVar2;
  value *pvVar3;
  undefined8 *puVar4;
  long *plVar5;
  long *plVar6;
  uint32_t index;
  anon_class_16_1_570cf4e1_for_f *this_00;
  pointer pvVar7;
  anon_union_32_5_7b1e0779_for_value_3 *this_01;
  undefined1 local_a0 [40];
  value *local_78;
  gc_heap_ptr_untyped *local_70;
  gc_heap *local_68;
  wstring_view local_60;
  undefined1 local_50 [16];
  
  this_00 = &this->f;
  pvVar3 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,pvVar3);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  if (this_->type_ == object) {
    this_01 = &this_->field_1;
    local_68 = (this_00->global).super_gc_heap_ptr_untyped.heap_;
    puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
    local_50._0_8_ = (gc_heap *)0x6;
    local_50._8_8_ = L"length";
    (**(code **)*puVar4)((value *)local_a0,puVar4);
    uVar2 = to_uint32((value *)local_a0);
    local_78 = __return_storage_ptr__;
    local_70 = (gc_heap_ptr_untyped *)this_00;
    value::destroy((value *)local_a0);
    pvVar7 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pvVar7 != pvVar1) {
      do {
        plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
        index_string_abi_cxx11_((wstring *)local_a0,(mjs *)(ulong)uVar2,index);
        local_60._M_len = local_a0._8_8_;
        local_60._M_str = (wchar_t *)local_a0._0_8_;
        string::string((string *)local_50,local_68,&local_60);
        (**(code **)(*plVar5 + 8))(plVar5,(gc_heap_ptr_untyped *)local_50,pvVar7,0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_50);
        if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
          operator_delete((void *)local_a0._0_8_,local_a0._16_8_ * 4 + 4);
        }
        pvVar7 = pvVar7 + 1;
        uVar2 = uVar2 + 1;
      } while (pvVar7 != pvVar1);
    }
    pvVar3 = local_78;
    local_78->type_ = number;
    (local_78->field_1).n_ = (double)uVar2;
    plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
    plVar6 = (long *)gc_heap_ptr_untyped::get(local_70);
    (**(code **)(*plVar6 + 0x98))(local_a0,plVar6,"length");
    (**(code **)(*plVar5 + 8))(plVar5,local_a0,pvVar3,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_a0);
    return pvVar3;
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }